

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitcell.hpp
# Opt level: O2

unitcell * lattice::unitcell::simple(unitcell *__return_storage_ptr__,size_t dim)

{
  size_t m;
  size_t sVar1;
  offset_t os;
  coordinate_t local_50;
  size_t local_40 [2];
  undefined8 local_30;
  
  __return_storage_ptr__->dim_ = dim;
  (__return_storage_ptr__->sites_).
  super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->sites_).
  super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->sites_).
  super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->bonds_).
  super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->bonds_).
  super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->bonds_).
  super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_30 = 0;
  local_40[0] = dim;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_50,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_40);
  add_site(__return_storage_ptr__,&local_50,0);
  free(local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  for (sVar1 = 0; dim != sVar1; sVar1 = sVar1 + 1) {
    local_30 = 0;
    local_40[0] = dim;
    Eigen::PlainObjectBase<Eigen::Matrix<long,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<long>,Eigen::Matrix<long,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<long,_1,1,0,_1,1>> *)&local_50,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<long>,_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>_>
                *)local_40);
    local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[sVar1]
         = 4.94065645841247e-324;
    add_bond(__return_storage_ptr__,0,0,(offset_t *)&local_50,0);
    free(local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  }
  return __return_storage_ptr__;
}

Assistant:

static unitcell simple(std::size_t dim) {
    unitcell cell(dim);
    cell.add_site(coordinate_t::Zero(dim), 0);
    for (std::size_t m = 0; m < dim; ++m) {
      offset_t os = offset_t::Zero(dim);
      os(m) = 1;
      cell.add_bond(0, 0, os, 0);
    }
    return cell;
  }